

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O0

void __thiscall ftxui::ComponentBase::Detach(ComponentBase *this)

{
  ComponentBase *pCVar1;
  const_iterator local_38;
  ComponentBase *local_30;
  shared_ptr<ftxui::ComponentBase> *local_28;
  __normal_iterator<std::shared_ptr<ftxui::ComponentBase>_*,_std::vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>_>
  local_20;
  __normal_iterator<std::shared_ptr<ftxui::ComponentBase>_*,_std::vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>_>
  local_18;
  __normal_iterator<std::shared_ptr<ftxui::ComponentBase>_*,_std::vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>_>
  it;
  ComponentBase *this_local;
  
  if (this->parent_ != (ComponentBase *)0x0) {
    it._M_current = (shared_ptr<ftxui::ComponentBase> *)this;
    local_20._M_current =
         (shared_ptr<ftxui::ComponentBase> *)
         std::
         begin<std::vector<std::shared_ptr<ftxui::ComponentBase>,std::allocator<std::shared_ptr<ftxui::ComponentBase>>>>
                   (&this->parent_->children_);
    local_28 = (shared_ptr<ftxui::ComponentBase> *)
               std::
               end<std::vector<std::shared_ptr<ftxui::ComponentBase>,std::allocator<std::shared_ptr<ftxui::ComponentBase>>>>
                         (&this->parent_->children_);
    local_30 = this;
    local_18 = std::
               find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<ftxui::ComponentBase>*,std::vector<std::shared_ptr<ftxui::ComponentBase>,std::allocator<std::shared_ptr<ftxui::ComponentBase>>>>,ftxui::ComponentBase::Detach()::__0>
                         (local_20,(__normal_iterator<std::shared_ptr<ftxui::ComponentBase>_*,_std::vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>_>
                                    )local_28,(anon_class_8_1_8991fb9c_for__M_pred)this);
    pCVar1 = this->parent_;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<ftxui::ComponentBase>const*,std::vector<std::shared_ptr<ftxui::ComponentBase>,std::allocator<std::shared_ptr<ftxui::ComponentBase>>>>
    ::__normal_iterator<std::shared_ptr<ftxui::ComponentBase>*>
              ((__normal_iterator<std::shared_ptr<ftxui::ComponentBase>const*,std::vector<std::shared_ptr<ftxui::ComponentBase>,std::allocator<std::shared_ptr<ftxui::ComponentBase>>>>
                *)&local_38,&local_18);
    std::
    vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
    ::erase(&pCVar1->children_,local_38);
    this->parent_ = (ComponentBase *)0x0;
  }
  return;
}

Assistant:

void ComponentBase::Detach() {
  if (!parent_)
    return;
  auto it = std::find_if(std::begin(parent_->children_),  //
                         std::end(parent_->children_),    //
                         [this](const Component& that) {  //
                           return this == that.get();
                         });
  parent_->children_.erase(it);
  parent_ = nullptr;
}